

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.h
# Opt level: O3

Mig_Obj_t * Mig_ManAppendObj(Mig_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  undefined8 *puVar3;
  void **ppvVar4;
  Mig_Obj_t *pMVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar6 = p->nObjs;
  if (uVar6 == 0x7fffffff) {
    __assert_fail("p->nObjs < MIG_NONE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                  ,0xdc,"Mig_Obj_t *Mig_ManAppendObj(Mig_Man_t *)");
  }
  uVar8 = (p->vPages).nSize;
  if (SBORROW4(uVar6,uVar8 * 0x1000) == (int)(uVar6 + uVar8 * -0x1000) < 0) {
    if (uVar6 != uVar8 * 0x1000) {
      __assert_fail("p->nObjs == (Vec_PtrSize(&p->vPages) << MIG_BASE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                    ,0xe0,"Mig_Obj_t *Mig_ManAppendObj(Mig_Man_t *)");
    }
    puVar3 = (undefined8 *)malloc(0x10020);
    memset(puVar3 + 1,0xff,0x10018);
    *puVar3 = p;
    if (uVar8 == (p->vPages).nCap) {
      if ((int)uVar8 < 0x10) {
        ppvVar4 = (p->vPages).pArray;
        if (ppvVar4 == (void **)0x0) {
          ppvVar4 = (void **)malloc(0x80);
        }
        else {
          ppvVar4 = (void **)realloc(ppvVar4,0x80);
        }
        (p->vPages).pArray = ppvVar4;
        (p->vPages).nCap = 0x10;
      }
      else {
        ppvVar4 = (p->vPages).pArray;
        if (ppvVar4 == (void **)0x0) {
          ppvVar4 = (void **)malloc((ulong)uVar8 << 4);
        }
        else {
          ppvVar4 = (void **)realloc(ppvVar4,(ulong)uVar8 << 4);
        }
        (p->vPages).pArray = ppvVar4;
        (p->vPages).nCap = uVar8 * 2;
      }
    }
    else {
      ppvVar4 = (p->vPages).pArray;
    }
    iVar1 = (p->vPages).nSize;
    uVar8 = iVar1 + 1;
    (p->vPages).nSize = uVar8;
    ppvVar4[iVar1] = puVar3 + 2;
    uVar6 = p->nObjs;
  }
  p->nObjs = uVar6 + 1;
  if ((int)uVar6 < 0) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                  ,0x74,"Mig_Obj_t *Mig_ManObj(Mig_Man_t *, int)");
  }
  if ((int)uVar8 <= (int)(uVar6 >> 0xc)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar2 = (p->vPages).pArray[uVar6 >> 0xc];
  uVar7 = (ulong)((uVar6 & 0xfff) << 4);
  uVar8 = *(uint *)((long)pvVar2 + uVar7 + 0xc);
  if (0xfffffffd < uVar8) {
    if (uVar6 != 0x7fffffff) {
      pMVar5 = (Mig_Obj_t *)((long)pvVar2 + uVar7);
      pMVar5->pFans[3] = (Mig_Fan_t)((uVar8 & 1) + uVar6 * 2);
      return pMVar5;
    }
    __assert_fail("v >= 0 && v < MIG_NONE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                  ,0x81,"int Mig_FanSetId(Mig_Obj_t *, int, int)");
  }
  __assert_fail("Mig_ObjIsNone(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                ,0xea,"Mig_Obj_t *Mig_ManAppendObj(Mig_Man_t *)");
}

Assistant:

static inline Mig_Obj_t * Mig_ManAppendObj( Mig_Man_t * p )
{
    Mig_Obj_t * pObj;
    assert( p->nObjs < MIG_NONE );
    if ( p->nObjs >= (Vec_PtrSize(&p->vPages) << MIG_BASE) )
    {
        Mig_Obj_t * pPage;// int i;
        assert( p->nObjs == (Vec_PtrSize(&p->vPages) << MIG_BASE) );
        pPage = ABC_FALLOC( Mig_Obj_t, MIG_MASK + 3 ); // 1 for mask, 1 for prefix, 1 for sentinel
        *((void **)pPage) = p;
//        *((void ***)(pPage + 1) - 1) = Vec_PtrArray(&p->vPages);
        Vec_PtrPush( &p->vPages, pPage + 1 );
//        if ( *((void ***)(pPage + 1) - 1) != Vec_PtrArray(&p->vPages) )
//            Vec_PtrForEachEntry( Mig_Obj_t *, &p->vPages, pPage, i )
//                *((void ***)pPage - 1) = Vec_PtrArray(&p->vPages);
    }
    pObj = Mig_ManObj( p, p->nObjs++ );
    assert( Mig_ObjIsNone(pObj) );
    Mig_ObjSetId( pObj, p->nObjs-1 );
    return pObj;
}